

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall
pbrt::PaddedSobolSampler::PaddedSobolSampler
          (PaddedSobolSampler *this,int spp,RandomizeStrategy randomizer)

{
  bool bVar1;
  int32_t iVar2;
  int32_t in_EDX;
  int32_t in_ESI;
  int32_t *in_RDI;
  int *in_stack_00000020;
  int *in_stack_00000028;
  char *in_stack_00000030;
  
  iVar2 = RoundUpPow2(in_ESI);
  *in_RDI = iVar2;
  in_RDI[1] = in_EDX;
  Point2<int>::Point2((Point2<int> *)CONCAT44(in_ESI,in_EDX));
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  bVar1 = IsPowerOf2<int>(in_ESI);
  if (!bVar1) {
    Warning<int&,int&>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  return;
}

Assistant:

PaddedSobolSampler::PaddedSobolSampler(int spp, RandomizeStrategy randomizer)
    : samplesPerPixel(RoundUpPow2(spp)), randomizeStrategy(randomizer) {
    if (!IsPowerOf2(spp))
        Warning("Pixel samples being rounded up to power of 2 (from %d to %d).", spp,
                samplesPerPixel);
}